

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

tmbchar ParseTagName(TidyDocImpl *doc)

{
  char cVar1;
  Lexer *lexer_00;
  int iVar2;
  Bool BVar3;
  uint uVar4;
  uint local_1c;
  Bool xml;
  uint c;
  Lexer *lexer;
  TidyDocImpl *doc_local;
  
  lexer_00 = doc->lexer;
  cVar1 = lexer_00->lexbuf[lexer_00->txtstart];
  iVar2 = (int)(doc->config).value[0x67].v;
  if ((iVar2 == 0) && (BVar3 = prvTidyIsUpper((int)cVar1), BVar3 != no)) {
    uVar4 = prvTidyToLower((int)cVar1);
    lexer_00->lexbuf[lexer_00->txtstart] = (tmbchar)uVar4;
  }
  while (((local_1c = prvTidyReadChar(doc->docIn), local_1c != 0xffffffff &&
          ((iVar2 != 0 || (BVar3 = prvTidyIsNamechar(local_1c), BVar3 != no)))) &&
         ((iVar2 == 0 || (BVar3 = prvTidyIsXMLNamechar(local_1c), BVar3 != no))))) {
    if ((iVar2 == 0) && (BVar3 = prvTidyIsUpper(local_1c), BVar3 != no)) {
      local_1c = prvTidyToLower(local_1c);
    }
    prvTidyAddCharToLexer(lexer_00,local_1c);
  }
  lexer_00->txtend = lexer_00->lexsize;
  return (tmbchar)local_1c;
}

Assistant:

static tmbchar ParseTagName( TidyDocImpl* doc )
{
    Lexer *lexer = doc->lexer;
    uint c = lexer->lexbuf[ lexer->txtstart ];
    Bool xml = cfgBool(doc, TidyXmlTags);

    /* fold case of first character in buffer */
    if (!xml && TY_(IsUpper)(c))
        lexer->lexbuf[lexer->txtstart] = (tmbchar) TY_(ToLower)(c);

    while ((c = TY_(ReadChar)(doc->docIn)) != EndOfStream)
    {
        if ((!xml && !TY_(IsNamechar)(c)) ||
            (xml && !TY_(IsXMLNamechar)(c)))
            break;

        /* fold case of subsequent characters */
        if (!xml && TY_(IsUpper)(c))
             c = TY_(ToLower)(c);

        TY_(AddCharToLexer)(lexer, c);
    }

    lexer->txtend = lexer->lexsize;
    return (tmbchar) c;
}